

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

bool __thiscall ON_COMPONENT_INDEX::IsSet(ON_COMPONENT_INDEX *this)

{
  bool local_11;
  bool rc;
  ON_COMPONENT_INDEX *this_local;
  
  switch(this->m_type) {
  case invalid_type:
    local_11 = false;
    break;
  case brep_vertex:
  case brep_edge:
  case brep_face:
  case brep_trim:
  case brep_loop:
  case mesh_vertex:
  case meshtop_vertex:
  case meshtop_edge:
  case mesh_face:
  case mesh_ngon:
  case idef_part:
  case polycurve_segment:
  case pointcloud_point:
  case group_member:
  case subd_vertex:
  case subd_edge:
  case subd_face:
  case hatch_loop:
  case dim_linear_point:
  case dim_radial_point:
  case dim_angular_point:
  case dim_ordinate_point:
  case dim_text_point:
  case dim_centermark_point:
  case dim_leader_point:
    local_11 = this->m_index != -1;
    break;
  default:
    local_11 = false;
    break;
  case no_type:
    local_11 = false;
  }
  return local_11;
}

Assistant:

bool ON_COMPONENT_INDEX::IsSet() const
{
  bool rc = false;
  switch(m_type)
  {
  case ON_COMPONENT_INDEX::invalid_type:
    rc = false;
    break;

  case ON_COMPONENT_INDEX::no_type:
    rc = false;
    break;

  case ON_COMPONENT_INDEX::brep_vertex:
  case ON_COMPONENT_INDEX::brep_edge:
  case ON_COMPONENT_INDEX::brep_face:
  case ON_COMPONENT_INDEX::brep_trim:
  case ON_COMPONENT_INDEX::brep_loop:

  case ON_COMPONENT_INDEX::mesh_vertex:
  case ON_COMPONENT_INDEX::meshtop_vertex:
  case ON_COMPONENT_INDEX::meshtop_edge:
  case ON_COMPONENT_INDEX::mesh_face:
  case ON_COMPONENT_INDEX::mesh_ngon:

  case ON_COMPONENT_INDEX::idef_part:
  case ON_COMPONENT_INDEX::polycurve_segment:
  case ON_COMPONENT_INDEX::pointcloud_point:
  case ON_COMPONENT_INDEX::group_member:

  case ON_COMPONENT_INDEX::subd_vertex:
  case ON_COMPONENT_INDEX::subd_edge:
  case ON_COMPONENT_INDEX::subd_face:

  case ON_COMPONENT_INDEX::hatch_loop:

  case ON_COMPONENT_INDEX::dim_linear_point:
  case ON_COMPONENT_INDEX::dim_radial_point:
  case ON_COMPONENT_INDEX::dim_angular_point:
  case ON_COMPONENT_INDEX::dim_ordinate_point:
  case ON_COMPONENT_INDEX::dim_text_point:
  case ON_COMPONENT_INDEX::dim_centermark_point:
  case ON_COMPONENT_INDEX::dim_leader_point:

    rc = (m_index != -1);
    break;

  default:
    rc = false;
    break;
  }
  return rc;
}